

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-arith-const.cc
# Opt level: O2

void __thiscall
dynet::ConstantMinusX::backward_dev_impl<dynet::Device_CPU>
          (ConstantMinusX *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_48;
  DefaultDevice *local_38;
  undefined1 *local_30;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_28;
  
  local_28 = Tensor::tvec(dEdf);
  local_48 = Tensor::tvec(dEdxi);
  local_38 = dev->edevice;
  local_30 = (undefined1 *)&local_48;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator-=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                *)&local_38,&local_28);
  return;
}

Assistant:

void ConstantMinusX::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  dEdxi.tvec().device(*dev.edevice) -= dEdf.tvec();
}